

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

void rec_new(char *identifer,Object value,Environment *parent)

{
  Object value_00;
  Record *toInsert;
  Object *__src;
  Record *env;
  Environment *parent_local;
  char *identifer_local;
  
  __src = &value;
  toInsert = (Record *)malloc(0x50);
  toInsert->name = identifer;
  value_00.field_1.routine.code.statements = (Statement *)__src;
  value_00._0_56_ = __src->field_1;
  incr_ref(value_00);
  memcpy(&toInsert->object,__src,0x40);
  toInsert->next = (Record *)0x0;
  insert(toInsert,parent);
  return;
}

Assistant:

static void rec_new(char* identifer, Object value, Environment *parent){
    Record *env = (Record *)mallocate(sizeof(Record));
    env->name = identifer;
    incr_ref(value);
    env->object = value;
    env->next = NULL;
    insert(env, parent);
}